

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::SonarQubeReporter::writeAssertions
          (SonarQubeReporter *this,SectionNode *sectionNode,bool okToFail)

{
  pointer pAVar1;
  AssertionStats *stats;
  AssertionOrBenchmarkResult *assertionOrBenchmark;
  pointer pAVar2;
  
  pAVar1 = (sectionNode->assertionsAndBenchmarks).
           super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pAVar2 = (sectionNode->assertionsAndBenchmarks).
                super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar2 != pAVar1; pAVar2 = pAVar2 + 1) {
    stats = (pAVar2->m_assertion).nullableValue;
    if (stats != (AssertionStats *)0x0) {
      writeAssertion(this,stats,okToFail);
    }
  }
  return;
}

Assistant:

IEventListenerPtr createReporter(std::string const& reporterName, ReporterConfig&& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, CATCH_MOVE(config));
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << '\'');

            return reporter;
        }